

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Workers.cpp
# Opt level: O0

void __thiscall xmrig::Workers<xmrig::CpuLaunchData>::Workers(Workers<xmrig::CpuLaunchData> *this)

{
  WorkersPrivate *this_00;
  long in_RDI;
  
  std::
  vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
  ::vector((vector<xmrig::Thread<xmrig::CpuLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::CpuLaunchData>_*>_>
            *)0x1f87f8);
  this_00 = (WorkersPrivate *)operator_new(0x10);
  memset(this_00,0,0x10);
  WorkersPrivate::WorkersPrivate(this_00);
  *(WorkersPrivate **)(in_RDI + 0x18) = this_00;
  return;
}

Assistant:

xmrig::Workers<T>::Workers() :
    d_ptr(new WorkersPrivate())
{

}